

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jnt_convolve_sse2.c
# Opt level: O2

void av1_dist_wtd_convolve_x_sse2
               (uint8_t *src,int src_stride,uint8_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params)

{
  int16_t *piVar1;
  CONV_BUF_TYPE *pCVar2;
  __m128i alVar3;
  int iVar4;
  int use_dist_wtd_avg;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined3 uVar31;
  undefined1 auVar32 [15];
  undefined3 uVar33;
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [11];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  long lVar42;
  char cVar43;
  int iVar44;
  int iVar45;
  CONV_BUF_TYPE *pCVar46;
  uint uVar47;
  long lVar48;
  undefined1 (*pauVar49) [16];
  short extraout_XMM0_Wa;
  short extraout_XMM0_Wa_00;
  uint3 uVar50;
  int extraout_XMM0_Da;
  int extraout_XMM0_Da_00;
  undefined8 extraout_XMM0_Qa;
  short extraout_XMM0_Wb_00;
  short extraout_XMM0_Wc;
  short extraout_XMM0_Wc_00;
  int extraout_XMM0_Db_00;
  short extraout_XMM0_Wd_00;
  short extraout_XMM0_We;
  short extraout_XMM0_We_00;
  int extraout_XMM0_Dc;
  int extraout_XMM0_Dc_00;
  short extraout_XMM0_Wf_00;
  short extraout_XMM0_Wg;
  short extraout_XMM0_Wg_00;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  int extraout_XMM0_Db;
  int extraout_XMM0_Dd;
  undefined1 auVar56 [16];
  short extraout_XMM0_Wb;
  short extraout_XMM0_Wd;
  short extraout_XMM0_Wf;
  short extraout_XMM0_Wh;
  undefined1 auVar57 [16];
  undefined8 extraout_XMM0_Qb;
  int extraout_XMM0_Dd_00;
  short extraout_XMM0_Wh_00;
  int iVar58;
  undefined4 uVar61;
  undefined4 uVar62;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  short sVar63;
  short sVar67;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  short sVar68;
  short sVar70;
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  int local_178;
  int iStack_174;
  int iStack_170;
  int iStack_16c;
  __m128i data_ref_0;
  __m128i res_unsigned;
  __m128i s [4];
  __m128i wt;
  __m128i coeffs [4];
  uint7 uVar51;
  undefined1 auVar52 [11];
  undefined1 auVar53 [15];
  
  pCVar46 = conv_params->dst;
  iVar4 = conv_params->dst_stride;
  iVar44 = 7 - conv_params->round_1;
  auVar54 = ZEXT416((uint)conv_params->round_0);
  wt[0]._0_4_ = CONCAT22((short)conv_params->bck_offset,(short)conv_params->fwd_offset);
  piVar1 = filter_params_x->filter_ptr + (subpel_x_qn & 0xfU) * (uint)filter_params_x->taps;
  coeffs[0][0]._0_4_ = *(undefined4 *)piVar1;
  coeffs[1][0]._0_4_ = *(undefined4 *)(piVar1 + 2);
  coeffs[2][0]._0_4_ = *(undefined4 *)(piVar1 + 4);
  coeffs[3][0]._0_4_ = *(undefined4 *)(piVar1 + 6);
  iVar45 = conv_params->round_0 + conv_params->round_1;
  cVar43 = (char)iVar45;
  auVar64 = ZEXT416((uint)((1 << (0x15U - cVar43 & 0x1f)) + (1 << (0x16U - cVar43 & 0x1f))));
  uVar47 = 0xe - iVar45;
  pauVar49 = (undefined1 (*) [16])(src + (1 - (ulong)(filter_params_x->taps >> 1)));
  iVar58 = (1 << ((byte)conv_params->round_0 & 0x1f)) >> 1;
  auVar59 = ZEXT416((uint)(1 << ((byte)uVar47 & 0x1f)) >> 1);
  iVar45 = conv_params->do_average;
  use_dist_wtd_avg = conv_params->use_dist_wtd_comp_avg;
  auVar64 = pshuflw(auVar64,auVar64,0);
  auVar59 = pshuflw(auVar59,auVar59,0);
  sVar63 = auVar64._0_2_;
  sVar67 = auVar64._2_2_;
  sVar68 = auVar59._0_2_;
  sVar70 = auVar59._2_2_;
  wt[0]._4_4_ = (undefined4)wt[0];
  wt[1]._0_4_ = (undefined4)wt[0];
  wt[1]._4_4_ = (undefined4)wt[0];
  coeffs[0][0]._4_4_ = (undefined4)coeffs[0][0];
  coeffs[0][1]._0_4_ = (undefined4)coeffs[0][0];
  coeffs[0][1]._4_4_ = (undefined4)coeffs[0][0];
  coeffs[1][0]._4_4_ = (undefined4)coeffs[1][0];
  coeffs[1][1]._0_4_ = (undefined4)coeffs[1][0];
  coeffs[1][1]._4_4_ = (undefined4)coeffs[1][0];
  coeffs[2][0]._4_4_ = (undefined4)coeffs[2][0];
  coeffs[2][1]._0_4_ = (undefined4)coeffs[2][0];
  coeffs[2][1]._4_4_ = (undefined4)coeffs[2][0];
  coeffs[3][0]._4_4_ = (undefined4)coeffs[3][0];
  coeffs[3][1]._0_4_ = (undefined4)coeffs[3][0];
  coeffs[3][1]._4_4_ = (undefined4)coeffs[3][0];
  if (w == 4) {
    do {
      auVar59 = *pauVar49;
      auVar29[0xd] = 0;
      auVar29._0_13_ = auVar59._0_13_;
      auVar29[0xe] = auVar59[7];
      auVar30[0xc] = auVar59[6];
      auVar30._0_12_ = auVar59._0_12_;
      auVar30._13_2_ = auVar29._13_2_;
      uVar31 = auVar30._12_3_;
      auVar32[0xb] = 0;
      auVar32._0_11_ = auVar59._0_11_;
      auVar32._12_3_ = uVar31;
      auVar34[10] = auVar59[5];
      auVar34._0_10_ = auVar59._0_10_;
      auVar34._11_4_ = auVar32._11_4_;
      auVar35[9] = 0;
      auVar35._0_9_ = auVar59._0_9_;
      auVar35._10_5_ = auVar34._10_5_;
      auVar36[8] = auVar59[4];
      auVar36._0_8_ = auVar59._0_8_;
      auVar36._9_6_ = auVar35._9_6_;
      auVar71[7] = 0;
      auVar71._0_7_ = auVar36._8_7_;
      auVar38._7_8_ = 0;
      auVar38._0_7_ = auVar36._8_7_;
      auVar40._1_8_ = SUB158(auVar38 << 0x40,7);
      auVar40[0] = auVar59[3];
      auVar40._9_6_ = 0;
      auVar39._1_10_ = SUB1510(auVar40 << 0x30,5);
      auVar39[0] = auVar59[2];
      auVar41._11_4_ = 0;
      auVar41._0_11_ = auVar39;
      auVar37._3_12_ = SUB1512(auVar41 << 0x20,3);
      auVar37[2] = auVar59[1];
      auVar37[1] = 0;
      auVar37[0] = auVar59[0];
      uVar61 = auVar39._0_4_;
      uVar62 = auVar36._8_4_;
      auVar65._4_4_ = uVar61;
      auVar65._0_4_ = auVar37._0_4_;
      auVar65._8_4_ = uVar62;
      auVar65._12_4_ = uVar61;
      auVar64 = pshuflw(auVar65,auVar65,0x94);
      auVar64 = pshufhw(auVar64,auVar64,0x3e);
      uVar50 = CONCAT12(auVar59[9],(ushort)auVar59[8]);
      uVar51 = CONCAT16(auVar59[0xb],(uint6)CONCAT14(auVar59[10],CONCAT13(0,uVar50)));
      auVar52._0_8_ = CONCAT17(0,uVar51);
      auVar52[8] = auVar59[0xc];
      auVar52[9] = 0;
      auVar52[10] = auVar59[0xd];
      auVar53[0xb] = 0;
      auVar53._0_11_ = auVar52;
      auVar53[0xc] = auVar59[0xe];
      auVar53[0xd] = 0;
      auVar53[0xe] = auVar59[0xf];
      auVar69._4_4_ = uVar61;
      auVar69._0_4_ = uVar62;
      auVar69._8_4_ = uVar62;
      auVar69._12_3_ = uVar31;
      auVar69[0xf] = 0;
      uVar33 = (undefined3)(uVar51 >> 0x20);
      auVar71._8_3_ = uVar50;
      auVar71[0xb] = 0;
      auVar71._12_3_ = uVar31;
      auVar71[0xf] = 0;
      auVar59 = pshuflw(auVar71,auVar71,0x94);
      auVar72 = pshufhw(auVar59,auVar59,0x3e);
      sVar5 = auVar64._0_2_;
      sVar6 = auVar64._2_2_;
      s[0][0]._1_1_ = (0 < sVar6) * (sVar6 < 0x100) * auVar64[2] - (0xff < sVar6);
      s[0][0]._0_1_ = (0 < sVar5) * (sVar5 < 0x100) * auVar64[0] - (0xff < sVar5);
      sVar5 = auVar64._4_2_;
      s[0][0]._2_1_ = (0 < sVar5) * (sVar5 < 0x100) * auVar64[4] - (0xff < sVar5);
      sVar5 = auVar64._6_2_;
      s[0][0]._3_1_ = (0 < sVar5) * (sVar5 < 0x100) * auVar64[6] - (0xff < sVar5);
      sVar5 = auVar64._8_2_;
      s[0][0]._4_1_ = (0 < sVar5) * (sVar5 < 0x100) * auVar64[8] - (0xff < sVar5);
      sVar5 = auVar64._10_2_;
      s[0][0]._5_1_ = (0 < sVar5) * (sVar5 < 0x100) * auVar64[10] - (0xff < sVar5);
      sVar5 = auVar64._12_2_;
      s[0][0]._6_1_ = (0 < sVar5) * (sVar5 < 0x100) * auVar64[0xc] - (0xff < sVar5);
      sVar5 = auVar64._14_2_;
      s[0][0]._7_1_ = (0 < sVar5) * (sVar5 < 0x100) * auVar64[0xe] - (0xff < sVar5);
      sVar13 = auVar72._0_2_;
      s[0][1]._0_1_ = (0 < sVar13) * (sVar13 < 0x100) * auVar72[0] - (0xff < sVar13);
      sVar15 = auVar72._2_2_;
      s[0][1]._1_1_ = (0 < sVar15) * (sVar15 < 0x100) * auVar72[2] - (0xff < sVar15);
      sVar17 = auVar72._4_2_;
      s[0][1]._2_1_ = (0 < sVar17) * (sVar17 < 0x100) * auVar72[4] - (0xff < sVar17);
      sVar19 = auVar72._6_2_;
      s[0][1]._3_1_ = (0 < sVar19) * (sVar19 < 0x100) * auVar72[6] - (0xff < sVar19);
      sVar21 = auVar72._8_2_;
      s[0][1]._4_1_ = (0 < sVar21) * (sVar21 < 0x100) * auVar72[8] - (0xff < sVar21);
      sVar23 = auVar72._10_2_;
      s[0][1]._5_1_ = (0 < sVar23) * (sVar23 < 0x100) * auVar72[10] - (0xff < sVar23);
      sVar25 = auVar72._12_2_;
      s[0][1]._6_1_ = (0 < sVar25) * (sVar25 < 0x100) * auVar72[0xc] - (0xff < sVar25);
      sVar27 = auVar72._14_2_;
      s[0][1]._7_1_ = (0 < sVar27) * (sVar27 < 0x100) * auVar72[0xe] - (0xff < sVar27);
      auVar60._4_3_ = uVar31;
      auVar60._0_4_ = CONCAT13(0,uVar50);
      auVar60[7] = 0;
      auVar60._8_3_ = uVar50;
      auVar60[0xb] = 0;
      auVar60._12_3_ = uVar33;
      auVar60[0xf] = 0;
      auVar59 = pshuflw(auVar60,auVar60,0x3e);
      auVar64 = pshufhw(auVar59,auVar59,0x94);
      auVar59 = pshuflw((undefined1  [16])s[0],auVar69,0x3e);
      auVar59 = pshufhw(auVar59,auVar59,0x94);
      sVar5 = auVar59._0_2_;
      sVar6 = auVar59._2_2_;
      sVar7 = auVar59._4_2_;
      sVar8 = auVar59._6_2_;
      sVar9 = auVar59._8_2_;
      sVar10 = auVar59._10_2_;
      sVar11 = auVar59._12_2_;
      sVar12 = auVar59._14_2_;
      sVar14 = auVar64._0_2_;
      sVar16 = auVar64._2_2_;
      sVar18 = auVar64._4_2_;
      sVar20 = auVar64._6_2_;
      sVar22 = auVar64._8_2_;
      sVar24 = auVar64._10_2_;
      sVar26 = auVar64._12_2_;
      sVar28 = auVar64._14_2_;
      s[1][0]._1_1_ = (0 < sVar6) * (sVar6 < 0x100) * auVar59[2] - (0xff < sVar6);
      s[1][0]._0_1_ = (0 < sVar5) * (sVar5 < 0x100) * auVar59[0] - (0xff < sVar5);
      s[1][0]._2_1_ = (0 < sVar7) * (sVar7 < 0x100) * auVar59[4] - (0xff < sVar7);
      s[1][0]._3_1_ = (0 < sVar8) * (sVar8 < 0x100) * auVar59[6] - (0xff < sVar8);
      s[1][0]._4_1_ = (0 < sVar9) * (sVar9 < 0x100) * auVar59[8] - (0xff < sVar9);
      s[1][0]._5_1_ = (0 < sVar10) * (sVar10 < 0x100) * auVar59[10] - (0xff < sVar10);
      s[1][0]._6_1_ = (0 < sVar11) * (sVar11 < 0x100) * auVar59[0xc] - (0xff < sVar11);
      s[1][0]._7_1_ = (0 < sVar12) * (sVar12 < 0x100) * auVar59[0xe] - (0xff < sVar12);
      s[1][1]._0_1_ = (0 < sVar14) * (sVar14 < 0x100) * auVar64[0] - (0xff < sVar14);
      s[1][1]._1_1_ = (0 < sVar16) * (sVar16 < 0x100) * auVar64[2] - (0xff < sVar16);
      s[1][1]._2_1_ = (0 < sVar18) * (sVar18 < 0x100) * auVar64[4] - (0xff < sVar18);
      s[1][1]._3_1_ = (0 < sVar20) * (sVar20 < 0x100) * auVar64[6] - (0xff < sVar20);
      s[1][1]._4_1_ = (0 < sVar22) * (sVar22 < 0x100) * auVar64[8] - (0xff < sVar22);
      s[1][1]._5_1_ = (0 < sVar24) * (sVar24 < 0x100) * auVar64[10] - (0xff < sVar24);
      s[1][1]._6_1_ = (0 < sVar26) * (sVar26 < 0x100) * auVar64[0xc] - (0xff < sVar26);
      s[1][1]._7_1_ = (0 < sVar28) * (sVar28 < 0x100) * auVar64[0xe] - (0xff < sVar28);
      uVar50 = auVar52._8_3_;
      auVar55[3] = 0;
      auVar55._0_3_ = uVar50;
      auVar66._8_3_ = uVar50;
      auVar66._0_8_ = auVar52._0_8_;
      auVar66[0xb] = 0;
      auVar66._12_3_ = uVar33;
      auVar66[0xf] = 0;
      auVar59 = pshuflw(auVar66,auVar66,0x94);
      auVar59 = pshufhw(auVar59,auVar59,0x3e);
      sVar5 = auVar59._0_2_;
      sVar6 = auVar59._2_2_;
      sVar7 = auVar59._4_2_;
      sVar8 = auVar59._6_2_;
      sVar9 = auVar59._8_2_;
      sVar10 = auVar59._10_2_;
      sVar11 = auVar59._12_2_;
      sVar12 = auVar59._14_2_;
      s[2][0]._1_1_ = (0 < sVar15) * (sVar15 < 0x100) * auVar72[2] - (0xff < sVar15);
      s[2][0]._0_1_ = (0 < sVar13) * (sVar13 < 0x100) * auVar72[0] - (0xff < sVar13);
      s[2][0]._2_1_ = (0 < sVar17) * (sVar17 < 0x100) * auVar72[4] - (0xff < sVar17);
      s[2][0]._3_1_ = (0 < sVar19) * (sVar19 < 0x100) * auVar72[6] - (0xff < sVar19);
      s[2][0]._4_1_ = (0 < sVar21) * (sVar21 < 0x100) * auVar72[8] - (0xff < sVar21);
      s[2][0]._5_1_ = (0 < sVar23) * (sVar23 < 0x100) * auVar72[10] - (0xff < sVar23);
      s[2][0]._6_1_ = (0 < sVar25) * (sVar25 < 0x100) * auVar72[0xc] - (0xff < sVar25);
      s[2][0]._7_1_ = (0 < sVar27) * (sVar27 < 0x100) * auVar72[0xe] - (0xff < sVar27);
      s[2][1]._0_1_ = (0 < sVar5) * (sVar5 < 0x100) * auVar59[0] - (0xff < sVar5);
      s[2][1]._1_1_ = (0 < sVar6) * (sVar6 < 0x100) * auVar59[2] - (0xff < sVar6);
      s[2][1]._2_1_ = (0 < sVar7) * (sVar7 < 0x100) * auVar59[4] - (0xff < sVar7);
      s[2][1]._3_1_ = (0 < sVar8) * (sVar8 < 0x100) * auVar59[6] - (0xff < sVar8);
      s[2][1]._4_1_ = (0 < sVar9) * (sVar9 < 0x100) * auVar59[8] - (0xff < sVar9);
      s[2][1]._5_1_ = (0 < sVar10) * (sVar10 < 0x100) * auVar59[10] - (0xff < sVar10);
      s[2][1]._6_1_ = (0 < sVar11) * (sVar11 < 0x100) * auVar59[0xc] - (0xff < sVar11);
      s[2][1]._7_1_ = (0 < sVar12) * (sVar12 < 0x100) * auVar59[0xe] - (0xff < sVar12);
      auVar55._4_3_ = uVar33;
      auVar55[7] = 0;
      auVar55._8_3_ = uVar50;
      auVar55[0xb] = 0;
      auVar55._12_3_ = auVar53._12_3_;
      auVar55[0xf] = 0;
      auVar59 = pshuflw(auVar55,auVar55,0x3e);
      auVar59 = pshufhw(auVar59,auVar59,0x94);
      sVar5 = auVar59._0_2_;
      sVar6 = auVar59._2_2_;
      sVar7 = auVar59._4_2_;
      sVar8 = auVar59._6_2_;
      sVar9 = auVar59._8_2_;
      sVar10 = auVar59._10_2_;
      sVar11 = auVar59._12_2_;
      sVar12 = auVar59._14_2_;
      s[3][0]._1_1_ = (0 < sVar16) * (sVar16 < 0x100) * auVar64[2] - (0xff < sVar16);
      s[3][0]._0_1_ = (0 < sVar14) * (sVar14 < 0x100) * auVar64[0] - (0xff < sVar14);
      s[3][0]._2_1_ = (0 < sVar18) * (sVar18 < 0x100) * auVar64[4] - (0xff < sVar18);
      s[3][0]._3_1_ = (0 < sVar20) * (sVar20 < 0x100) * auVar64[6] - (0xff < sVar20);
      s[3][0]._4_1_ = (0 < sVar22) * (sVar22 < 0x100) * auVar64[8] - (0xff < sVar22);
      s[3][0]._5_1_ = (0 < sVar24) * (sVar24 < 0x100) * auVar64[10] - (0xff < sVar24);
      s[3][0]._6_1_ = (0 < sVar26) * (sVar26 < 0x100) * auVar64[0xc] - (0xff < sVar26);
      s[3][0]._7_1_ = (0 < sVar28) * (sVar28 < 0x100) * auVar64[0xe] - (0xff < sVar28);
      s[3][1]._0_1_ = (0 < sVar5) * (sVar5 < 0x100) * auVar59[0] - (0xff < sVar5);
      s[3][1]._1_1_ = (0 < sVar6) * (sVar6 < 0x100) * auVar59[2] - (0xff < sVar6);
      s[3][1]._2_1_ = (0 < sVar7) * (sVar7 < 0x100) * auVar59[4] - (0xff < sVar7);
      s[3][1]._3_1_ = (0 < sVar8) * (sVar8 < 0x100) * auVar59[6] - (0xff < sVar8);
      s[3][1]._4_1_ = (0 < sVar9) * (sVar9 < 0x100) * auVar59[8] - (0xff < sVar9);
      s[3][1]._5_1_ = (0 < sVar10) * (sVar10 < 0x100) * auVar59[10] - (0xff < sVar10);
      s[3][1]._6_1_ = (0 < sVar11) * (sVar11 < 0x100) * auVar59[0xc] - (0xff < sVar11);
      s[3][1]._7_1_ = (0 < sVar12) * (sVar12 < 0x100) * auVar59[0xe] - (0xff < sVar12);
      convolve_lo_x(s,coeffs);
      auVar56._4_4_ = extraout_XMM0_Db + iVar58 >> auVar54;
      auVar56._8_4_ = extraout_XMM0_Dc + iVar58 >> auVar54;
      auVar56._12_4_ = extraout_XMM0_Dd + iVar58 >> auVar54;
      auVar56._0_4_ = (extraout_XMM0_Da + iVar58 >> auVar54) << iVar44;
      auVar59 = packssdw(auVar56,auVar56);
      res_unsigned[0]._0_2_ = auVar59._0_2_ + sVar63;
      res_unsigned[0]._2_2_ = auVar59._2_2_ + sVar67;
      res_unsigned[0]._4_2_ = auVar59._4_2_ + sVar63;
      res_unsigned[0]._6_2_ = auVar59._6_2_ + sVar67;
      res_unsigned[1]._0_2_ = auVar59._8_2_ + sVar63;
      res_unsigned[1]._2_2_ = auVar59._10_2_ + sVar67;
      res_unsigned[1]._4_2_ = auVar59._12_2_ + sVar63;
      res_unsigned[1]._6_2_ = auVar59._14_2_ + sVar67;
      if (iVar45 == 0) {
        *pCVar46 = (CONV_BUF_TYPE)res_unsigned[0];
        pCVar46[1] = res_unsigned[0]._2_2_;
        pCVar46[2] = res_unsigned[0]._4_2_;
        pCVar46[3] = res_unsigned[0]._6_2_;
        pCVar46[4] = (CONV_BUF_TYPE)res_unsigned[1];
        pCVar46[5] = res_unsigned[1]._2_2_;
        pCVar46[6] = res_unsigned[1]._4_2_;
        pCVar46[7] = res_unsigned[1]._6_2_;
      }
      else {
        data_ref_0[0] = *(longlong *)pCVar46;
        data_ref_0[1] = *(longlong *)(pCVar46 + 4);
        comp_avg(&data_ref_0,&res_unsigned,&wt,use_dist_wtd_avg);
        auVar57._0_2_ = extraout_XMM0_Wa + (sVar68 - sVar63);
        auVar57._2_2_ = extraout_XMM0_Wb + (sVar70 - sVar67);
        auVar57._4_2_ = extraout_XMM0_Wc + (sVar68 - sVar63);
        auVar57._6_2_ = extraout_XMM0_Wd + (sVar70 - sVar67);
        auVar57._8_2_ = extraout_XMM0_We + (sVar68 - sVar63);
        auVar57._10_2_ = extraout_XMM0_Wf + (sVar70 - sVar67);
        auVar57._12_2_ = extraout_XMM0_Wg + (sVar68 - sVar63);
        auVar57._14_2_ = extraout_XMM0_Wh + (sVar70 - sVar67);
        auVar59 = psraw(auVar57,ZEXT416(uVar47));
        sVar5 = auVar59._0_2_;
        sVar6 = auVar59._2_2_;
        sVar7 = auVar59._4_2_;
        sVar8 = auVar59._6_2_;
        *(uint *)dst0 =
             CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar59[6] - (0xff < sVar8),
                      CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar59[4] - (0xff < sVar7),
                               CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar59[2] - (0xff < sVar6),
                                        (0 < sVar5) * (sVar5 < 0x100) * auVar59[0] - (0xff < sVar5))
                              ));
      }
      pauVar49 = (undefined1 (*) [16])(*pauVar49 + src_stride);
      dst0 = dst0 + dst_stride0;
      pCVar46 = pCVar46 + iVar4;
      h = h + -1;
    } while (h != 0);
  }
  else {
    lVar42 = 0;
    do {
      lVar48 = 0;
      do {
        alVar3 = *(__m128i *)(*pauVar49 + lVar48);
        s[1] = (__m128i)((undefined1  [16])alVar3 >> 0x10);
        s[2] = (__m128i)((undefined1  [16])alVar3 >> 0x20);
        s[3] = (__m128i)((undefined1  [16])alVar3 >> 0x30);
        s[0] = alVar3;
        convolve_lo_x(s,coeffs);
        s[0] = (__m128i)((undefined1  [16])alVar3 >> 8);
        s[1] = (__m128i)((undefined1  [16])alVar3 >> 0x18);
        s[2] = (__m128i)((undefined1  [16])alVar3 >> 0x28);
        s[3] = (__m128i)((undefined1  [16])alVar3 >> 0x38);
        convolve_lo_x(s,coeffs);
        local_178 = (int)extraout_XMM0_Qa;
        iStack_174 = (int)((ulong)extraout_XMM0_Qa >> 0x20);
        iStack_170 = (int)extraout_XMM0_Qb;
        iStack_16c = (int)((ulong)extraout_XMM0_Qb >> 0x20);
        auVar59._4_4_ = extraout_XMM0_Da_00 + iVar58 >> auVar54;
        auVar59._8_4_ = iStack_174 + iVar58 >> auVar54;
        auVar59._12_4_ = extraout_XMM0_Db_00 + iVar58 >> auVar54;
        auVar64._4_4_ = extraout_XMM0_Dc_00 + iVar58 >> auVar54;
        auVar64._8_4_ = iStack_16c + iVar58 >> auVar54;
        auVar64._12_4_ = extraout_XMM0_Dd_00 + iVar58 >> auVar54;
        auVar59._0_4_ = (local_178 + iVar58 >> auVar54) << iVar44;
        auVar64._0_4_ = (iStack_170 + iVar58 >> auVar54) << iVar44;
        auVar59 = packssdw(auVar59,auVar64);
        res_unsigned[0]._0_2_ = auVar59._0_2_ + sVar63;
        res_unsigned[0]._2_2_ = auVar59._2_2_ + sVar67;
        res_unsigned[0]._4_2_ = auVar59._4_2_ + sVar63;
        res_unsigned[0]._6_2_ = auVar59._6_2_ + sVar67;
        res_unsigned[1]._0_2_ = auVar59._8_2_ + sVar63;
        res_unsigned[1]._2_2_ = auVar59._10_2_ + sVar67;
        res_unsigned[1]._4_2_ = auVar59._12_2_ + sVar63;
        res_unsigned[1]._6_2_ = auVar59._14_2_ + sVar67;
        if (iVar45 == 0) {
          pCVar2 = pCVar46 + lVar48;
          *pCVar2 = (CONV_BUF_TYPE)res_unsigned[0];
          pCVar2[1] = res_unsigned[0]._2_2_;
          pCVar2[2] = res_unsigned[0]._4_2_;
          pCVar2[3] = res_unsigned[0]._6_2_;
          pCVar2[4] = (CONV_BUF_TYPE)res_unsigned[1];
          pCVar2[5] = res_unsigned[1]._2_2_;
          pCVar2[6] = res_unsigned[1]._4_2_;
          pCVar2[7] = res_unsigned[1]._6_2_;
        }
        else {
          data_ref_0[0] = *(longlong *)(pCVar46 + lVar48);
          data_ref_0[1] = *(longlong *)(pCVar46 + lVar48 + 4);
          comp_avg(&data_ref_0,&res_unsigned,&wt,use_dist_wtd_avg);
          auVar72._0_2_ = extraout_XMM0_Wa_00 + (sVar68 - sVar63);
          auVar72._2_2_ = extraout_XMM0_Wb_00 + (sVar70 - sVar67);
          auVar72._4_2_ = extraout_XMM0_Wc_00 + (sVar68 - sVar63);
          auVar72._6_2_ = extraout_XMM0_Wd_00 + (sVar70 - sVar67);
          auVar72._8_2_ = extraout_XMM0_We_00 + (sVar68 - sVar63);
          auVar72._10_2_ = extraout_XMM0_Wf_00 + (sVar70 - sVar67);
          auVar72._12_2_ = extraout_XMM0_Wg_00 + (sVar68 - sVar63);
          auVar72._14_2_ = extraout_XMM0_Wh_00 + (sVar70 - sVar67);
          auVar59 = psraw(auVar72,ZEXT416(uVar47));
          sVar5 = auVar59._0_2_;
          sVar6 = auVar59._2_2_;
          sVar7 = auVar59._4_2_;
          sVar8 = auVar59._6_2_;
          sVar9 = auVar59._8_2_;
          sVar10 = auVar59._10_2_;
          sVar11 = auVar59._12_2_;
          sVar12 = auVar59._14_2_;
          *(ulong *)(dst0 + lVar48) =
               CONCAT17((0 < sVar12) * (sVar12 < 0x100) * auVar59[0xe] - (0xff < sVar12),
                        CONCAT16((0 < sVar11) * (sVar11 < 0x100) * auVar59[0xc] - (0xff < sVar11),
                                 CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar59[10] -
                                          (0xff < sVar10),
                                          CONCAT14((0 < sVar9) * (sVar9 < 0x100) * auVar59[8] -
                                                   (0xff < sVar9),
                                                   CONCAT13((0 < sVar8) * (sVar8 < 0x100) *
                                                            auVar59[6] - (0xff < sVar8),
                                                            CONCAT12((0 < sVar7) * (sVar7 < 0x100) *
                                                                     auVar59[4] - (0xff < sVar7),
                                                                     CONCAT11((0 < sVar6) *
                                                                              (sVar6 < 0x100) *
                                                                              auVar59[2] -
                                                                              (0xff < sVar6),
                                                                              (0 < sVar5) *
                                                                              (sVar5 < 0x100) *
                                                                              auVar59[0] -
                                                                              (0xff < sVar5))))))));
        }
        lVar48 = lVar48 + 8;
      } while (lVar48 < w);
      lVar42 = lVar42 + 1;
      pCVar46 = pCVar46 + iVar4;
      dst0 = dst0 + dst_stride0;
      pauVar49 = (undefined1 (*) [16])(*pauVar49 + src_stride);
    } while (lVar42 < h);
  }
  return;
}

Assistant:

void av1_dist_wtd_convolve_x_sse2(const uint8_t *src, int src_stride,
                                  uint8_t *dst0, int dst_stride0, int w, int h,
                                  const InterpFilterParams *filter_params_x,
                                  const int subpel_x_qn,
                                  ConvolveParams *conv_params) {
  const int bd = 8;
  CONV_BUF_TYPE *dst = conv_params->dst;
  const int dst_stride = conv_params->dst_stride;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const uint8_t *src_ptr = src - fo_horiz;
  const int bits = FILTER_BITS - conv_params->round_1;
  const __m128i left_shift = _mm_cvtsi32_si128(bits);
  const __m128i round_const = _mm_set1_epi32((1 << conv_params->round_0) >> 1);
  const __m128i round_shift = _mm_cvtsi32_si128(conv_params->round_0);
  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m128i wt0 = _mm_set1_epi16(w0);
  const __m128i wt1 = _mm_set1_epi16(w1);
  const __m128i wt = _mm_unpacklo_epi16(wt0, wt1);
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m128i offset_const = _mm_set1_epi16(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m128i rounding_const = _mm_set1_epi16((1 << rounding_shift) >> 1);
  __m128i coeffs[4];

  prepare_coeffs(filter_params_x, subpel_x_qn, coeffs);

  if (w == 4) {
    do {
      const __m128i data = _mm_loadu_si128((__m128i *)src_ptr);
      __m128i s[4];

      s[0] = _mm_unpacklo_epi8(data, _mm_srli_si128(data, 1));
      s[1] =
          _mm_unpacklo_epi8(_mm_srli_si128(data, 2), _mm_srli_si128(data, 3));
      s[2] =
          _mm_unpacklo_epi8(_mm_srli_si128(data, 4), _mm_srli_si128(data, 5));
      s[3] =
          _mm_unpacklo_epi8(_mm_srli_si128(data, 6), _mm_srli_si128(data, 7));
      const __m128i res_lo = convolve_lo_x(s, coeffs);
      const __m128i res_lo_round =
          _mm_sra_epi32(_mm_add_epi32(res_lo, round_const), round_shift);
      const __m128i res_lo_shift = _mm_sll_epi32(res_lo_round, left_shift);

      const __m128i res_16b = _mm_packs_epi32(res_lo_shift, res_lo_shift);
      const __m128i res_unsigned = _mm_add_epi16(res_16b, offset_const);

      // Accumulate values into the destination buffer
      if (do_average) {
        const __m128i data_ref_0 = _mm_loadu_si128((__m128i *)dst);

        const __m128i comp_avg_res =
            comp_avg(&data_ref_0, &res_unsigned, &wt, use_dist_wtd_comp_avg);

        const __m128i round_result = convolve_rounding(
            &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

        const __m128i res_8 = _mm_packus_epi16(round_result, round_result);
        *(int *)(&dst0[0]) = _mm_cvtsi128_si32(res_8);
      } else {
        _mm_store_si128((__m128i *)(&dst[0]), res_unsigned);
      }
      src_ptr += src_stride;
      dst += dst_stride;
      dst0 += dst_stride0;
    } while (--h);
  } else {
    assert(!(w % 8));
    int i = 0;
    do {
      int j = 0;
      do {
        const __m128i data =
            _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);
        __m128i s[4];

        // Filter even-index pixels
        s[0] = data;
        s[1] = _mm_srli_si128(data, 2);
        s[2] = _mm_srli_si128(data, 4);
        s[3] = _mm_srli_si128(data, 6);
        const __m128i res_even = convolve_lo_x(s, coeffs);

        // Filter odd-index pixels
        s[0] = _mm_srli_si128(data, 1);
        s[1] = _mm_srli_si128(data, 3);
        s[2] = _mm_srli_si128(data, 5);
        s[3] = _mm_srli_si128(data, 7);
        const __m128i res_odd = convolve_lo_x(s, coeffs);

        // Rearrange pixels back into the order 0 ... 7
        const __m128i res_lo = _mm_unpacklo_epi32(res_even, res_odd);
        const __m128i res_hi = _mm_unpackhi_epi32(res_even, res_odd);
        const __m128i res_lo_round =
            _mm_sra_epi32(_mm_add_epi32(res_lo, round_const), round_shift);
        const __m128i res_hi_round =
            _mm_sra_epi32(_mm_add_epi32(res_hi, round_const), round_shift);
        const __m128i res_lo_shift = _mm_sll_epi32(res_lo_round, left_shift);
        const __m128i res_hi_shift = _mm_sll_epi32(res_hi_round, left_shift);

        const __m128i res_16b = _mm_packs_epi32(res_lo_shift, res_hi_shift);
        const __m128i res_unsigned = _mm_add_epi16(res_16b, offset_const);

        // Accumulate values into the destination buffer
        if (do_average) {
          const __m128i data_ref_0 =
              _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j]));

          const __m128i comp_avg_res =
              comp_avg(&data_ref_0, &res_unsigned, &wt, use_dist_wtd_comp_avg);

          const __m128i round_result = convolve_rounding(
              &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

          const __m128i res_8 = _mm_packus_epi16(round_result, round_result);
          _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_8);
        } else {
          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_unsigned);
        }
        j += 8;
      } while (j < w);
    } while (++i < h);
  }
}